

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

pair<bool,_unsigned_long> __thiscall
FloatTokenizerRule::handleFraction(FloatTokenizerRule *this,shared_ptr<Readable> *reader,size_t i)

{
  element_type *peVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 uVar3;
  pair<bool,_unsigned_long> pVar4;
  
  peVar1 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  iVar2 = (*peVar1->_vptr_Readable[2])(peVar1,i);
  if ((char)iVar2 == '.') {
    do {
      i = i + 1;
      peVar1 = (reader->super___shared_ptr<Readable,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      iVar2 = (*peVar1->_vptr_Readable[2])(peVar1,i);
    } while ((byte)((char)iVar2 - 0x30U) < 10);
    uVar3 = CONCAT71((int7)(CONCAT44(extraout_var,iVar2) >> 8),1);
  }
  else {
    uVar3 = 0;
    i = 0;
  }
  pVar4.second = i;
  pVar4._0_8_ = uVar3;
  return pVar4;
}

Assistant:

std::pair<bool, std::size_t> handleFraction(
    const std::shared_ptr<Readable>& reader,
    std::size_t i) {

    if (reader->charAt(i) != '.') {
      return std::make_pair(false, 0);
    }

    i++;

    while (isNumeric(reader->charAt(i))) {
      i++;
    }

    return std::make_pair(true, i);
  }